

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_eth.c
# Opt level: O0

_Bool csp_eth_pack_header(csp_eth_header_t *buf,uint16_t packet_id,uint16_t src_addr,
                         uint16_t seg_size,uint16_t packet_length)

{
  __uint16_t _Var1;
  __uint16_t in_CX;
  __uint16_t in_DX;
  __uint16_t in_SI;
  long in_RDI;
  __uint16_t in_R8W;
  
  if (in_RDI != 0) {
    _Var1 = __bswap_16(in_SI);
    *(__uint16_t *)(in_RDI + 0xe) = _Var1;
    _Var1 = __bswap_16(in_DX);
    *(__uint16_t *)(in_RDI + 0x10) = _Var1;
    _Var1 = __bswap_16(in_CX);
    *(__uint16_t *)(in_RDI + 0x12) = _Var1;
    _Var1 = __bswap_16(in_R8W);
    *(__uint16_t *)(in_RDI + 0x14) = _Var1;
  }
  return in_RDI != 0;
}

Assistant:

bool csp_eth_pack_header(csp_eth_header_t * buf, 
                            uint16_t packet_id, uint16_t src_addr,
                            uint16_t seg_size, uint16_t packet_length) {

    if (buf == NULL) return false;

    buf->packet_id = htobe16(packet_id);
    buf->src_addr = htobe16(src_addr);
    buf->seg_size = htobe16(seg_size);
    buf->packet_length = htobe16(packet_length);

    return true;
}